

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

int __thiscall
CVmObjHTTPRequest::getp_getFormFields
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  OS_Counter *pOVar1;
  uint uVar2;
  long lVar3;
  _func_int **pp_Var4;
  CVmObjPageEntry *pCVar5;
  _func_int *startp;
  _func_int *p_Var6;
  anon_union_8_8_cb74652f_for_val aVar7;
  anon_union_8_8_cb74652f_for_val aVar8;
  bool bVar9;
  vm_datatype_t *pvVar10;
  vm_val_t *pvVar11;
  TadsHttpRequestHeader *pTVar12;
  size_t sVar13;
  int iVar14;
  vm_obj_id_t vVar15;
  char *pcVar16;
  char *pcVar17;
  StringRef *this_00;
  CVmDataSource *fp;
  char cVar18;
  undefined4 uVar19;
  ulong unaff_RBP;
  undefined4 in_register_00000034;
  char *pcVar20;
  char *pcVar21;
  _func_int **len;
  TadsHttpRequestHeader *hdrs;
  _func_int **local_b0;
  vm_val_t fldval;
  size_t bndry_len;
  char *bndry;
  vm_val_t keyval;
  size_t filename_len;
  size_t fldname_len;
  char *filename;
  char *fldname;
  TadsHttpRequestHeader *hdrs_tail;
  
  if ((getp_getFormFields(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar14 = __cxa_guard_acquire(&getp_getFormFields(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                   CONCAT44(in_register_00000034,self)), iVar14 != 0)) {
    getp_getFormFields::desc.min_argc_ = 0;
    getp_getFormFields::desc.opt_argc_ = 0;
    getp_getFormFields::desc.varargs_ = 0;
    __cxa_guard_release(&getp_getFormFields(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar14 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getFormFields::desc);
  if (iVar14 != 0) {
    return 1;
  }
  lVar3 = *(long *)(this->super_CVmObject).ext_;
  if (*(int *)(lVar3 + 0x68) != 0) {
    vVar15 = CVmObjString::create(0,"overflow",8);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar15;
    return 1;
  }
  pp_Var4 = *(_func_int ***)(lVar3 + 0x60);
  if (pp_Var4 == (_func_int **)0x0) {
LAB_00204fd5:
    retval->typ = VM_NIL;
  }
  else {
    pcVar16 = TadsHttpRequestHeader::find(*(TadsHttpRequestHeader **)(lVar3 + 0x58),"content-type");
    if (pcVar16 != (char *)0x0) {
      iVar14 = memicmp(pcVar16,"application/x-www-form-urlencoded",0x21);
      if (iVar14 == 0) {
        oargc = (uint *)0x1;
        unaff_RBP = 0;
      }
      else {
        iVar14 = memicmp(pcVar16,"multipart/form-data",0x13);
        if (iVar14 != 0) goto LAB_00204fd5;
        unaff_RBP = 1;
        oargc = (uint *)0x0;
      }
    }
    vVar15 = CVmObjLookupTable::create(0,0x20,0x40);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar15;
    pvVar11 = sp_;
    uVar19 = *(undefined4 *)&retval->field_0x4;
    aVar7 = retval->val;
    sp_ = sp_ + 1;
    pvVar11->typ = retval->typ;
    *(undefined4 *)&pvVar11->field_0x4 = uVar19;
    pvVar11->val = aVar7;
    uVar2 = (retval->val).obj;
    pCVar5 = G_obj_table_X.pages_[uVar2 >> 0xc];
    if (((ulong)oargc & 1) == 0) {
      if (((unaff_RBP & 1) != 0) &&
         (iVar14 = parse_attr_token(pcVar16,"boundary",&bndry,&bndry_len), iVar14 != 0)) {
        startp = pp_Var4[2];
        p_Var6 = pp_Var4[3];
        pcVar16 = next_boundary((char *)startp,(char *)(p_Var6 + (long)startp),bndry,bndry_len,0);
        while ((sVar13 = bndry_len, pcVar16 != (char *)0x0 &&
               ((cVar18 = pcVar16[bndry_len], cVar18 != '-' || (pcVar16[bndry_len + 1] != '-'))))) {
          pcVar20 = pcVar16 + bndry_len + 2;
          pcVar21 = pcVar20;
          while ((cVar18 == '\t' || (cVar18 == ' '))) {
            pcVar16 = pcVar20 + -1;
            pcVar20 = pcVar20 + 1;
            pcVar21 = pcVar21 + 1;
            cVar18 = *pcVar16;
          }
          if (((cVar18 != '\r') || (pcVar20[-1] != '\n')) ||
             (pcVar17 = strstr(pcVar20,"\r\n\r\n"), pcVar17 == (char *)0x0)) break;
          local_b0 = (_func_int **)(pcVar17 + 4);
          pcVar16 = next_boundary((char *)local_b0,(char *)(p_Var6 + (long)startp),bndry,sVar13,1);
          if (pcVar16 == (char *)0x0) break;
          this_00 = (StringRef *)operator_new(0x28);
          StringRef::StringRef(this_00,pcVar20,(long)pcVar17 - (long)pcVar21);
          hdrs = (TadsHttpRequestHeader *)0x0;
          hdrs_tail = (TadsHttpRequestHeader *)0x0;
          TadsHttpRequestHeader::parse_headers(&hdrs,&hdrs_tail,1,this_00,0);
          pcVar21 = TadsHttpRequestHeader::find(hdrs,"content-disposition");
          pcVar20 = TadsHttpRequestHeader::find(hdrs,"content-type");
          if (pcVar20 == (char *)0x0) {
            pcVar20 = "text/plain; charset=utf-8";
          }
          if (((pcVar21 == (char *)0x0) || (iVar14 = bcmp(pcVar21,"form-data",9), iVar14 != 0)) ||
             (iVar14 = parse_attr_token(pcVar21,"name",&fldname,&fldname_len), iVar14 == 0)) {
LAB_00205428:
            pcVar21 = (char *)0x0;
            bVar9 = true;
          }
          else {
            len = (_func_int **)(pcVar16 + (-4 - (long)local_b0));
            iVar14 = parse_attr_token(pcVar21,"filename",&filename,&filename_len);
            sVar13 = filename_len;
            if (((iVar14 == 0) || (filename_len == 0)) || (len == (_func_int **)0x0)) {
              if (iVar14 == 0) {
                new_parsed_str(&fldval,(char *)local_b0,(size_t)len,0);
              }
              else {
                fldval.typ = VM_NIL;
              }
              pvVar11 = sp_;
              sp_ = sp_ + 1;
              pvVar11->typ = fldval.typ;
              *(undefined4 *)&pvVar11->field_0x4 = fldval._4_4_;
              pvVar11->val = fldval.val;
LAB_002053e3:
              new_parsed_str(&keyval,fldname,fldname_len,3);
              pvVar11 = sp_;
              aVar8._4_4_ = keyval.val._4_4_;
              aVar8.obj = keyval.val.obj;
              sp_ = sp_ + 1;
              pvVar11->typ = keyval.typ;
              *(undefined4 *)&pvVar11->field_0x4 = keyval._4_4_;
              pvVar11->val = aVar8;
              CVmObjLookupTable::set_or_add_entry
                        ((CVmObjLookupTable *)(pCVar5 + (uVar2 & 0xfff)),&keyval,&fldval);
              sp_ = sp_ + -2;
              goto LAB_00205428;
            }
            iVar14 = get_charset_map(pcVar20,&keyval);
            pvVar11 = sp_;
            aVar7._4_4_ = keyval.val._4_4_;
            aVar7.obj = keyval.val.obj;
            sp_ = sp_ + 1;
            pvVar11->typ = keyval.typ;
            *(undefined4 *)&pvVar11->field_0x4 = keyval._4_4_;
            pvVar11->val = aVar7;
            fp = (CVmDataSource *)operator_new(0x28);
            fp[1]._vptr_CVmDataSource = local_b0;
            fp[2]._vptr_CVmDataSource = len;
            fp[3]._vptr_CVmDataSource = (_func_int **)0x0;
            fp->_vptr_CVmDataSource = (_func_int **)&PTR__CVmStringRefSource_00343af0;
            fp[4]._vptr_CVmDataSource = pp_Var4;
            LOCK();
            pp_Var4[1] = pp_Var4[1] + 1;
            UNLOCK();
            uVar19 = 0;
            if (iVar14 == 1) {
              uVar19 = keyval.val.obj;
            }
            vVar15 = CVmObjFile::create(0,(CVmNetFile *)0x0,uVar19,fp,iVar14,1,(uint)(iVar14 == 1));
            pvVar11 = sp_;
            sp_[-1].typ = VM_OBJ;
            pvVar11[-1].val.obj = vVar15;
            if (G_predef_X.file_upload_cl != 0) {
              CVmRun::push_string(&G_interpreter_X,filename,sVar13);
              CVmRun::push_string(&G_interpreter_X,pcVar20);
              pvVar11 = sp_;
              pvVar10 = &sp_->typ;
              sp_ = sp_ + 1;
              *pvVar10 = VM_OBJ;
              (pvVar11->val).obj = vVar15;
              (**(code **)(*(long *)&G_obj_table_X.pages_[G_predef_X.file_upload_cl >> 0xc]
                                     [G_predef_X.file_upload_cl & 0xfff].ptr_ + 0x18))
                        (G_obj_table_X.pages_[G_predef_X.file_upload_cl >> 0xc] +
                         (G_predef_X.file_upload_cl & 0xfff),G_predef_X.file_upload_cl,0,3);
              aVar7 = r0_.val;
              pvVar11 = sp_;
              fldval.typ = r0_.typ;
              fldval._4_4_ = r0_._4_4_;
              fldval.val = r0_.val;
              uVar19 = r0_._4_4_;
              sp_ = sp_ + -1;
              pvVar11[-2].typ = r0_.typ;
              *(undefined4 *)&pvVar11[-2].field_0x4 = uVar19;
              pvVar11[-2].val = aVar7;
              goto LAB_002053e3;
            }
            bVar9 = false;
            pcVar21 = "Parsing form fields: FileUpload class is missing";
          }
          pTVar12 = hdrs;
          if (hdrs != (TadsHttpRequestHeader *)0x0) {
            TadsHttpRequestHeader::~TadsHttpRequestHeader(hdrs);
          }
          operator_delete(pTVar12,0x18);
          LOCK();
          pOVar1 = &(this_00->super_CVmRefCntObj).cnt;
          (pOVar1->cnt).super___atomic_base<long>._M_i =
               (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
          UNLOCK();
          if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
            (*(this_00->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])(this_00);
          }
          if (!bVar9) {
            throw_net_err(pcVar21,0);
          }
        }
      }
    }
    else {
      parse_query_params((CVmObjLookupTable *)(pCVar5 + (uVar2 & 0xfff)),(char *)pp_Var4[2],2);
    }
    sp_ = sp_ + -1;
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getFormFields(VMG_ vm_obj_id_t self,
                                          vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the headers from the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsHttpRequestHeader *hdrs = req->hdr_list;
    StringRef *body = req->body;

    /* if the body was too large, return 'overflow' */
    if (req->overflow)
    {
        retval->set_obj(CVmObjString::create(vmg_ FALSE, "overflow", 8));
        return TRUE;
    }

    /* if there's no message body, there are no form fields */
    if (body == 0)
    {
        retval->set_nil();
        return TRUE;
    }

    /* find the content type header */
    const char *ct = hdrs->find("content-type");
    int typ;
    if (ct != 0)
    {
        /* check what we have */
        if (memicmp(ct, "application/x-www-form-urlencoded", 33) == 0)
            typ = 0;
        else if (memicmp(ct, "multipart/form-data", 19) == 0)
            typ = 1;
        else
        {
            /* it's not a posted format we recognize - return nil */
            retval->set_nil();
            return TRUE;
        }
    }

    /* create a lookup table to hold the result; push it for gc protection */
    retval->set_obj(CVmObjLookupTable::create(vmg_ FALSE, 32, 64));
    G_stk->push(retval);
    CVmObjLookupTable *tab =
        (CVmObjLookupTable *)vm_objp(vmg_ retval->val.obj);

    /* parse the content type that we found */
    if (typ == 0)
    {
        /* 
         *   URL-encoded form data.  This is the same format as a URL query
         *   string, so we can just apply that parser to the message body. 
         */
        parse_query_params(vmg_ tab, body->get(), ENCMODE_FORM);
    }
    else if (typ == 1)
    {
        /* 
         *   Multipart form-data.  Invoke our generic multipart parser.  
         */
        parse_multipart(vmg_ tab, body, ct);
    }

    /* done with the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}